

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.cpp
# Opt level: O2

void __thiscall
Diligent::ThreadPoolImpl::ThreadPoolImpl
          (ThreadPoolImpl *this,IReferenceCounters *pRefCounters,ThreadPoolCreateInfo *PoolCI)

{
  _Rb_tree_header *p_Var1;
  ulong uVar2;
  anon_class_88_3_32cfcbc8_for__M_head_impl local_88;
  
  ObjectBase<Diligent::IThreadPool>::ObjectBase
            (&this->super_ObjectBase<Diligent::IThreadPool>,pRefCounters);
  (this->super_ObjectBase<Diligent::IThreadPool>).super_RefCountedObject<Diligent::IThreadPool>.
  super_IThreadPool.super_IObject._vptr_IObject = (_func_int **)&PTR_QueryInterface_008a7720;
  (this->m_TasksQueue)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_TasksQueue)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->m_TasksQueue)._M_t._M_impl.super__Rb_tree_header;
  (this->m_WorkerThreads).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_WorkerThreads).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_WorkerThreads).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_TasksQueueMtx).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_TasksQueueMtx).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->m_TasksQueueMtx).super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_TasksQueueMtx).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->m_TasksQueueMtx).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->m_TasksQueue)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_TasksQueue)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_TasksQueue)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_ReprioritizationList).
  super__Vector_base<std::pair<float,_Diligent::ThreadPoolImpl::QueuedTaskInfo>,_std::allocator<std::pair<float,_Diligent::ThreadPoolImpl::QueuedTaskInfo>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_ReprioritizationList).
  super__Vector_base<std::pair<float,_Diligent::ThreadPoolImpl::QueuedTaskInfo>,_std::allocator<std::pair<float,_Diligent::ThreadPoolImpl::QueuedTaskInfo>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_ReprioritizationList).
  super__Vector_base<std::pair<float,_Diligent::ThreadPoolImpl::QueuedTaskInfo>,_std::allocator<std::pair<float,_Diligent::ThreadPoolImpl::QueuedTaskInfo>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::condition_variable::condition_variable(&this->m_NextTaskCond);
  std::condition_variable::condition_variable(&this->m_TasksFinishedCond);
  (this->m_Stop)._M_base._M_i = false;
  (this->m_NumRunningTasks).super___atomic_base<int>._M_i = 0;
  std::vector<std::thread,_std::allocator<std::thread>_>::reserve
            (&this->m_WorkerThreads,PoolCI->NumThreads);
  for (uVar2 = 0; uVar2 < PoolCI->NumThreads; uVar2 = (ulong)((Uint32)uVar2 + 1)) {
    local_88.this = this;
    ThreadPoolCreateInfo::ThreadPoolCreateInfo(&local_88.PoolCI,PoolCI);
    local_88.i = (Uint32)uVar2;
    std::vector<std::thread,std::allocator<std::thread>>::
    emplace_back<Diligent::ThreadPoolImpl::ThreadPoolImpl(Diligent::IReferenceCounters*,Diligent::ThreadPoolCreateInfo_const&)::_lambda()_1_>
              ((vector<std::thread,std::allocator<std::thread>> *)&this->m_WorkerThreads,&local_88);
    ThreadPoolCreateInfo::~ThreadPoolCreateInfo(&local_88.PoolCI);
  }
  return;
}

Assistant:

ThreadPoolImpl(IReferenceCounters*         pRefCounters,
                   const ThreadPoolCreateInfo& PoolCI) :
        TBase{pRefCounters}
    {
        m_WorkerThreads.reserve(PoolCI.NumThreads);
        for (Uint32 i = 0; i < PoolCI.NumThreads; ++i)
        {
            m_WorkerThreads.emplace_back(
                [this, PoolCI, i] //
                {
                    if (PoolCI.OnThreadStarted)
                        PoolCI.OnThreadStarted(i);

                    while (ProcessTask(i, /*WaitForTask =*/true))
                    {
                    }

                    if (PoolCI.OnThreadExiting)
                        PoolCI.OnThreadExiting(i);
                });
        }
    }